

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred_sse.c
# Opt level: O2

void uavs3d_ipred_ang_xy_16_sse(pel *src,pel *dst,int i_dst,int mode,int width,int height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  undefined1 (*pauVar9) [16];
  ulong uVar10;
  int iVar11;
  short sVar12;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  undefined1 in_XMM0 [16];
  undefined1 auVar13 [16];
  short sVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ushort uVar24;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  undefined1 in_XMM4 [16];
  undefined1 auVar25 [16];
  ushort uVar32;
  undefined1 in_XMM5 [16];
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  undefined1 in_XMM8 [16];
  short sVar41;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  undefined1 in_XMM9 [16];
  undefined1 auVar42 [16];
  short sVar49;
  short sVar50;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  undefined1 in_XMM10 [16];
  undefined1 auVar51 [16];
  short sVar58;
  undefined1 in_XMM11 [16];
  pel first_line [224];
  
  iVar3 = height / 2;
  uVar10 = (long)(iVar3 + width + 0x1e) & 0xfffffffffffffff0;
  iVar11 = height + -2;
  lVar5 = 0;
  auVar13 = pmovsxbw(in_XMM0,0x202020202020202);
  auVar21 = ZEXT816(0xf0d0b0907050301);
  auVar22 = ZEXT816(0xe0c0a0806040200);
  while( true ) {
    sVar12 = auVar13._0_2_;
    sVar14 = auVar13._2_2_;
    sVar15 = auVar13._4_2_;
    sVar16 = auVar13._6_2_;
    sVar17 = auVar13._8_2_;
    sVar18 = auVar13._10_2_;
    sVar19 = auVar13._12_2_;
    sVar20 = auVar13._14_2_;
    if (iVar3 + -5 <= lVar5) break;
    auVar23 = *(undefined1 (*) [16])(src + lVar5 * 2 + (-1 - (long)iVar11));
    auVar1 = *(undefined1 (*) [16])(src + (lVar5 * 2 - (long)iVar11));
    auVar2 = *(undefined1 (*) [16])(src + lVar5 * 2 + (1 - (long)iVar11));
    in_XMM8 = pmovzxbw(in_XMM8,auVar23);
    auVar25 = pmovzxbw(in_XMM4,auVar1);
    auVar42 = pmovzxbw(in_XMM9,auVar2);
    in_XMM9._0_2_ = auVar42._0_2_ + in_XMM8._0_2_;
    in_XMM9._2_2_ = auVar42._2_2_ + in_XMM8._2_2_;
    in_XMM9._4_2_ = auVar42._4_2_ + in_XMM8._4_2_;
    in_XMM9._6_2_ = auVar42._6_2_ + in_XMM8._6_2_;
    in_XMM9._8_2_ = auVar42._8_2_ + in_XMM8._8_2_;
    in_XMM9._10_2_ = auVar42._10_2_ + in_XMM8._10_2_;
    in_XMM9._12_2_ = auVar42._12_2_ + in_XMM8._12_2_;
    in_XMM9._14_2_ = auVar42._14_2_ + in_XMM8._14_2_;
    uVar24 = (ushort)(auVar25._0_2_ * 2 + in_XMM9._0_2_ + sVar12) >> 2;
    uVar26 = (ushort)(auVar25._2_2_ * 2 + in_XMM9._2_2_ + sVar14) >> 2;
    uVar27 = (ushort)(auVar25._4_2_ * 2 + in_XMM9._4_2_ + sVar15) >> 2;
    uVar28 = (ushort)(auVar25._6_2_ * 2 + in_XMM9._6_2_ + sVar16) >> 2;
    uVar29 = (ushort)(auVar25._8_2_ * 2 + in_XMM9._8_2_ + sVar17) >> 2;
    uVar30 = (ushort)(auVar25._10_2_ * 2 + in_XMM9._10_2_ + sVar18) >> 2;
    uVar31 = (ushort)(auVar25._12_2_ * 2 + in_XMM9._12_2_ + sVar19) >> 2;
    uVar32 = (ushort)(auVar25._14_2_ * 2 + in_XMM9._14_2_ + sVar20) >> 2;
    uVar33 = (ushort)((ushort)auVar1[8] * 2 + (ushort)auVar2[8] + (ushort)auVar23[8] + sVar12) >> 2;
    uVar34 = (ushort)((ushort)auVar1[9] * 2 + (ushort)auVar2[9] + (ushort)auVar23[9] + sVar14) >> 2;
    uVar35 = (ushort)((ushort)auVar1[10] * 2 + (ushort)auVar2[10] + (ushort)auVar23[10] + sVar15) >>
             2;
    uVar36 = (ushort)((ushort)auVar1[0xb] * 2 + (ushort)auVar2[0xb] + (ushort)auVar23[0xb] + sVar16)
             >> 2;
    uVar37 = (ushort)((ushort)auVar1[0xc] * 2 + (ushort)auVar2[0xc] + (ushort)auVar23[0xc] + sVar17)
             >> 2;
    uVar38 = (ushort)((ushort)auVar1[0xd] * 2 + (ushort)auVar2[0xd] + (ushort)auVar23[0xd] + sVar18)
             >> 2;
    uVar39 = (ushort)((ushort)auVar1[0xe] * 2 + (ushort)auVar2[0xe] + (ushort)auVar23[0xe] + sVar19)
             >> 2;
    uVar40 = (ushort)((ushort)auVar1[0xf] * 2 + (ushort)auVar2[0xf] + (ushort)auVar23[0xf] + sVar20)
             >> 2;
    auVar23[1] = (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26);
    auVar23[0] = (uVar24 != 0) * (uVar24 < 0x100) * (char)uVar24 - (0xff < uVar24);
    auVar23[2] = (uVar27 != 0) * (uVar27 < 0x100) * (char)uVar27 - (0xff < uVar27);
    auVar23[3] = (uVar28 != 0) * (uVar28 < 0x100) * (char)uVar28 - (0xff < uVar28);
    auVar23[4] = (uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 - (0xff < uVar29);
    auVar23[5] = (uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 - (0xff < uVar30);
    auVar23[6] = (uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 - (0xff < uVar31);
    auVar23[7] = (uVar32 != 0) * (uVar32 < 0x100) * (char)uVar32 - (0xff < uVar32);
    auVar23[8] = (uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33);
    auVar23[9] = (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34);
    auVar23[10] = (uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35);
    auVar23[0xb] = (uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36);
    auVar23[0xc] = (uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37);
    auVar23[0xd] = (uVar38 != 0) * (uVar38 < 0x100) * (char)uVar38 - (0xff < uVar38);
    auVar23[0xe] = (uVar39 != 0) * (uVar39 < 0x100) * (char)uVar39 - (0xff < uVar39);
    auVar23[0xf] = (uVar40 != 0) * (uVar40 < 0x100) * (char)uVar40 - (0xff < uVar40);
    in_XMM5 = pshufb(auVar23,auVar21);
    in_XMM4 = pshufb(auVar23,auVar22);
    *(long *)(first_line + lVar5 + uVar10) = in_XMM4._0_8_;
    *(long *)(first_line + lVar5) = in_XMM5._0_8_;
    lVar5 = lVar5 + 8;
  }
  if ((int)lVar5 < iVar3 + -1) {
    auVar13 = pmovzxbw((undefined1  [16])0x0,*(undefined8 *)(src + lVar5 * 2 + (-1 - (long)iVar11)))
    ;
    auVar21 = pmovzxbw(auVar21,*(undefined8 *)(src + (lVar5 * 2 - (long)iVar11)));
    auVar23 = pmovzxbw(auVar22,*(undefined8 *)(src + lVar5 * 2 + (1 - (long)iVar11)));
    auVar22._0_2_ = auVar23._0_2_ + auVar13._0_2_;
    auVar22._2_2_ = auVar23._2_2_ + auVar13._2_2_;
    auVar22._4_2_ = auVar23._4_2_ + auVar13._4_2_;
    auVar22._6_2_ = auVar23._6_2_ + auVar13._6_2_;
    auVar22._8_2_ = auVar23._8_2_ + auVar13._8_2_;
    auVar22._10_2_ = auVar23._10_2_ + auVar13._10_2_;
    auVar22._12_2_ = auVar23._12_2_ + auVar13._12_2_;
    auVar22._14_2_ = auVar23._14_2_ + auVar13._14_2_;
    uVar24 = (ushort)(auVar21._0_2_ * 2 + auVar22._0_2_ + 2U) >> 2;
    uVar26 = (ushort)(auVar21._2_2_ * 2 + auVar22._2_2_ + 2U) >> 2;
    uVar27 = (ushort)(auVar21._4_2_ * 2 + auVar22._4_2_ + 2U) >> 2;
    uVar28 = (ushort)(auVar21._6_2_ * 2 + auVar22._6_2_ + 2U) >> 2;
    uVar29 = (ushort)(auVar21._8_2_ * 2 + auVar22._8_2_ + 2U) >> 2;
    uVar30 = (ushort)(auVar21._10_2_ * 2 + auVar22._10_2_ + 2U) >> 2;
    uVar31 = (ushort)(auVar21._12_2_ * 2 + auVar22._12_2_ + 2U) >> 2;
    uVar32 = (ushort)(auVar21._14_2_ * 2 + auVar22._14_2_ + 2U) >> 2;
    auVar21[1] = (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26);
    auVar21[0] = (uVar24 != 0) * (uVar24 < 0x100) * (char)uVar24 - (0xff < uVar24);
    auVar21[2] = (uVar27 != 0) * (uVar27 < 0x100) * (char)uVar27 - (0xff < uVar27);
    auVar21[3] = (uVar28 != 0) * (uVar28 < 0x100) * (char)uVar28 - (0xff < uVar28);
    auVar21[4] = (uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 - (0xff < uVar29);
    auVar21[5] = (uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 - (0xff < uVar30);
    auVar21[6] = (uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 - (0xff < uVar31);
    auVar21[7] = (uVar32 != 0) * (uVar32 < 0x100) * (char)uVar32 - (0xff < uVar32);
    auVar21[8] = (uVar24 != 0) * (uVar24 < 0x100) * (char)uVar24 - (0xff < uVar24);
    auVar21[9] = (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26);
    auVar21[10] = (uVar27 != 0) * (uVar27 < 0x100) * (char)uVar27 - (0xff < uVar27);
    auVar21[0xb] = (uVar28 != 0) * (uVar28 < 0x100) * (char)uVar28 - (0xff < uVar28);
    auVar21[0xc] = (uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 - (0xff < uVar29);
    auVar21[0xd] = (uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 - (0xff < uVar30);
    auVar21[0xe] = (uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 - (0xff < uVar31);
    auVar21[0xf] = (uVar32 != 0) * (uVar32 < 0x100) * (char)uVar32 - (0xff < uVar32);
    auVar13 = pshufb(auVar21,_DAT_0017a200);
    auVar21 = pshufb(auVar21,_DAT_0017a210);
    *(int *)(first_line + uVar10 + lVar5) = auVar21._0_4_;
    *(int *)(first_line + lVar5) = auVar13._0_4_;
  }
  lVar6 = (long)(iVar3 + -1);
  pauVar9 = (undefined1 (*) [16])(src + (lVar6 * 2 - (long)iVar11));
  auVar13 = pmovsxbw(auVar21,0x303030303030303);
  auVar21 = pmovsxbw(auVar22,0x404040404040404);
  for (lVar5 = lVar6; lVar5 < iVar3 + width + -1; lVar5 = lVar5 + 0x10) {
    auVar22 = *(undefined1 (*) [16])(pauVar9[-1] + 0xf);
    auVar23 = *pauVar9;
    auVar1 = *(undefined1 (*) [16])(*pauVar9 + 1);
    auVar2 = *(undefined1 (*) [16])(*pauVar9 + 2);
    auVar25 = pmovzxbw(in_XMM5,auVar22);
    in_XMM11 = pmovzxbw(in_XMM11,auVar23);
    auVar51 = pmovzxbw(in_XMM10,auVar1);
    auVar42 = pmovzxbw(in_XMM8,auVar2);
    sVar50 = auVar51._0_2_ + in_XMM11._0_2_;
    sVar52 = auVar51._2_2_ + in_XMM11._2_2_;
    sVar53 = auVar51._4_2_ + in_XMM11._4_2_;
    sVar54 = auVar51._6_2_ + in_XMM11._6_2_;
    sVar55 = auVar51._8_2_ + in_XMM11._8_2_;
    sVar56 = auVar51._10_2_ + in_XMM11._10_2_;
    sVar57 = auVar51._12_2_ + in_XMM11._12_2_;
    sVar58 = auVar51._14_2_ + in_XMM11._14_2_;
    sVar41 = (ushort)auVar1[8] + (ushort)auVar23[8];
    sVar43 = (ushort)auVar1[9] + (ushort)auVar23[9];
    sVar44 = (ushort)auVar1[10] + (ushort)auVar23[10];
    sVar45 = (ushort)auVar1[0xb] + (ushort)auVar23[0xb];
    sVar46 = (ushort)auVar1[0xc] + (ushort)auVar23[0xc];
    sVar47 = (ushort)auVar1[0xd] + (ushort)auVar23[0xd];
    sVar48 = (ushort)auVar1[0xe] + (ushort)auVar23[0xe];
    sVar49 = (ushort)auVar1[0xf] + (ushort)auVar23[0xf];
    in_XMM10._0_2_ = sVar50 * auVar13._0_2_;
    in_XMM10._2_2_ = sVar52 * auVar13._2_2_;
    in_XMM10._4_2_ = sVar53 * auVar13._4_2_;
    in_XMM10._6_2_ = sVar54 * auVar13._6_2_;
    in_XMM10._8_2_ = sVar55 * auVar13._8_2_;
    in_XMM10._10_2_ = sVar56 * auVar13._10_2_;
    in_XMM10._12_2_ = sVar57 * auVar13._12_2_;
    in_XMM10._14_2_ = sVar58 * auVar13._14_2_;
    uVar33 = (ushort)(auVar42._0_2_ + auVar25._0_2_ + auVar21._0_2_ + in_XMM10._0_2_) >> 3;
    uVar34 = (ushort)(auVar42._2_2_ + auVar25._2_2_ + auVar21._2_2_ + in_XMM10._2_2_) >> 3;
    uVar35 = (ushort)(auVar42._4_2_ + auVar25._4_2_ + auVar21._4_2_ + in_XMM10._4_2_) >> 3;
    uVar36 = (ushort)(auVar42._6_2_ + auVar25._6_2_ + auVar21._6_2_ + in_XMM10._6_2_) >> 3;
    uVar37 = (ushort)(auVar42._8_2_ + auVar25._8_2_ + auVar21._8_2_ + in_XMM10._8_2_) >> 3;
    uVar38 = (ushort)(auVar42._10_2_ + auVar25._10_2_ + auVar21._10_2_ + in_XMM10._10_2_) >> 3;
    uVar39 = (ushort)(auVar42._12_2_ + auVar25._12_2_ + auVar21._12_2_ + in_XMM10._12_2_) >> 3;
    uVar40 = (ushort)(auVar42._14_2_ + auVar25._14_2_ + auVar21._14_2_ + in_XMM10._14_2_) >> 3;
    uVar24 = (ushort)((ushort)auVar2[8] + (ushort)auVar22[8] + auVar21._0_2_ +
                     sVar41 * auVar13._0_2_) >> 3;
    uVar26 = (ushort)((ushort)auVar2[9] + (ushort)auVar22[9] + auVar21._2_2_ +
                     sVar43 * auVar13._2_2_) >> 3;
    uVar27 = (ushort)((ushort)auVar2[10] + (ushort)auVar22[10] + auVar21._4_2_ +
                     sVar44 * auVar13._4_2_) >> 3;
    uVar28 = (ushort)((ushort)auVar2[0xb] + (ushort)auVar22[0xb] + auVar21._6_2_ +
                     sVar45 * auVar13._6_2_) >> 3;
    uVar29 = (ushort)((ushort)auVar2[0xc] + (ushort)auVar22[0xc] + auVar21._8_2_ +
                     sVar46 * auVar13._8_2_) >> 3;
    uVar30 = (ushort)((ushort)auVar2[0xd] + (ushort)auVar22[0xd] + auVar21._10_2_ +
                     sVar47 * auVar13._10_2_) >> 3;
    uVar31 = (ushort)((ushort)auVar2[0xe] + (ushort)auVar22[0xe] + auVar21._12_2_ +
                     sVar48 * auVar13._12_2_) >> 3;
    uVar32 = (ushort)((ushort)auVar2[0xf] + (ushort)auVar22[0xf] + auVar21._14_2_ +
                     sVar49 * auVar13._14_2_) >> 3;
    in_XMM8[1] = (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34);
    in_XMM8[0] = (uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33);
    in_XMM8[2] = (uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35);
    in_XMM8[3] = (uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36);
    in_XMM8[4] = (uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37);
    in_XMM8[5] = (uVar38 != 0) * (uVar38 < 0x100) * (char)uVar38 - (0xff < uVar38);
    in_XMM8[6] = (uVar39 != 0) * (uVar39 < 0x100) * (char)uVar39 - (0xff < uVar39);
    in_XMM8[7] = (uVar40 != 0) * (uVar40 < 0x100) * (char)uVar40 - (0xff < uVar40);
    in_XMM8[8] = (uVar24 != 0) * (uVar24 < 0x100) * (char)uVar24 - (0xff < uVar24);
    in_XMM8[9] = (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26);
    in_XMM8[10] = (uVar27 != 0) * (uVar27 < 0x100) * (char)uVar27 - (0xff < uVar27);
    in_XMM8[0xb] = (uVar28 != 0) * (uVar28 < 0x100) * (char)uVar28 - (0xff < uVar28);
    in_XMM8[0xc] = (uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 - (0xff < uVar29);
    in_XMM8[0xd] = (uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 - (0xff < uVar30);
    in_XMM8[0xe] = (uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 - (0xff < uVar31);
    in_XMM8[0xf] = (uVar32 != 0) * (uVar32 < 0x100) * (char)uVar32 - (0xff < uVar32);
    *(undefined1 (*) [16])(first_line + lVar5) = in_XMM8;
    uVar33 = (ushort)(auVar25._0_2_ + in_XMM11._0_2_ + sVar50 + sVar12) >> 2;
    uVar34 = (ushort)(auVar25._2_2_ + in_XMM11._2_2_ + sVar52 + sVar14) >> 2;
    uVar35 = (ushort)(auVar25._4_2_ + in_XMM11._4_2_ + sVar53 + sVar15) >> 2;
    uVar36 = (ushort)(auVar25._6_2_ + in_XMM11._6_2_ + sVar54 + sVar16) >> 2;
    uVar37 = (ushort)(auVar25._8_2_ + in_XMM11._8_2_ + sVar55 + sVar17) >> 2;
    uVar38 = (ushort)(auVar25._10_2_ + in_XMM11._10_2_ + sVar56 + sVar18) >> 2;
    uVar39 = (ushort)(auVar25._12_2_ + in_XMM11._12_2_ + sVar57 + sVar19) >> 2;
    uVar40 = (ushort)(auVar25._14_2_ + in_XMM11._14_2_ + sVar58 + sVar20) >> 2;
    uVar24 = (ushort)((ushort)auVar23[8] + (ushort)auVar22[8] + sVar41 + sVar12) >> 2;
    uVar26 = (ushort)((ushort)auVar23[9] + (ushort)auVar22[9] + sVar43 + sVar14) >> 2;
    uVar27 = (ushort)((ushort)auVar23[10] + (ushort)auVar22[10] + sVar44 + sVar15) >> 2;
    uVar28 = (ushort)((ushort)auVar23[0xb] + (ushort)auVar22[0xb] + sVar45 + sVar16) >> 2;
    uVar29 = (ushort)((ushort)auVar23[0xc] + (ushort)auVar22[0xc] + sVar46 + sVar17) >> 2;
    uVar30 = (ushort)((ushort)auVar23[0xd] + (ushort)auVar22[0xd] + sVar47 + sVar18) >> 2;
    uVar31 = (ushort)((ushort)auVar23[0xe] + (ushort)auVar22[0xe] + sVar48 + sVar19) >> 2;
    uVar32 = (ushort)((ushort)auVar23[0xf] + (ushort)auVar22[0xf] + sVar49 + sVar20) >> 2;
    in_XMM5[1] = (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34);
    in_XMM5[0] = (uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33);
    in_XMM5[2] = (uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35);
    in_XMM5[3] = (uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36);
    in_XMM5[4] = (uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37);
    in_XMM5[5] = (uVar38 != 0) * (uVar38 < 0x100) * (char)uVar38 - (0xff < uVar38);
    in_XMM5[6] = (uVar39 != 0) * (uVar39 < 0x100) * (char)uVar39 - (0xff < uVar39);
    in_XMM5[7] = (uVar40 != 0) * (uVar40 < 0x100) * (char)uVar40 - (0xff < uVar40);
    in_XMM5[8] = (uVar24 != 0) * (uVar24 < 0x100) * (char)uVar24 - (0xff < uVar24);
    in_XMM5[9] = (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26);
    in_XMM5[10] = (uVar27 != 0) * (uVar27 < 0x100) * (char)uVar27 - (0xff < uVar27);
    in_XMM5[0xb] = (uVar28 != 0) * (uVar28 < 0x100) * (char)uVar28 - (0xff < uVar28);
    in_XMM5[0xc] = (uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 - (0xff < uVar29);
    in_XMM5[0xd] = (uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 - (0xff < uVar30);
    in_XMM5[0xe] = (uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 - (0xff < uVar31);
    in_XMM5[0xf] = (uVar32 != 0) * (uVar32 < 0x100) * (char)uVar32 - (0xff < uVar32);
    *(undefined1 (*) [16])(first_line + lVar5 + uVar10) = in_XMM5;
    pauVar9 = pauVar9 + 1;
  }
  lVar5 = lVar6 + uVar10 + -0x118;
  uVar8 = height >> 1;
  if (width == 4) {
    uVar7 = 0;
    uVar10 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar10 = uVar7;
    }
    for (; -uVar7 != uVar10; uVar7 = uVar7 - 1) {
      *(undefined4 *)dst = *(undefined4 *)(first_line + uVar7 + lVar6);
      *(undefined4 *)(dst + i_dst) = *(undefined4 *)(first_line + uVar7 + lVar5 + 0x118);
      dst = dst + i_dst * 2;
    }
  }
  else if (width == 8) {
    uVar7 = 0;
    uVar10 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar10 = uVar7;
    }
    for (; -uVar7 != uVar10; uVar7 = uVar7 - 1) {
      *(undefined8 *)dst = *(undefined8 *)(first_line + uVar7 + lVar6);
      *(undefined8 *)(dst + i_dst) = *(undefined8 *)(first_line + uVar7 + lVar5 + 0x118);
      dst = dst + i_dst * 2;
    }
  }
  else if (width == 0x10) {
    uVar7 = 0;
    uVar10 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar10 = uVar7;
    }
    for (; -uVar7 != uVar10; uVar7 = uVar7 - 1) {
      uVar4 = *(undefined8 *)(first_line + uVar7 + lVar6 + 8);
      *(undefined8 *)dst = *(undefined8 *)(first_line + uVar7 + lVar6);
      *(undefined8 *)(dst + 8) = uVar4;
      uVar4 = *(undefined8 *)(first_line + uVar7 + lVar5 + 0x118 + 8);
      *(undefined8 *)(dst + i_dst) = *(undefined8 *)(first_line + uVar7 + lVar5 + 0x118);
      *(undefined8 *)(dst + i_dst + 8) = uVar4;
      dst = dst + i_dst * 2;
    }
  }
  else {
    uVar7 = 0;
    uVar10 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar10 = uVar7;
    }
    for (; -uVar7 != uVar10; uVar7 = uVar7 - 1) {
      memcpy(dst,first_line + uVar7 + lVar6,(long)width);
      memcpy(dst + i_dst,first_line + uVar7 + lVar5 + 0x118,(long)width);
      dst = dst + i_dst * 2;
    }
  }
  return;
}

Assistant:

void uavs3d_ipred_ang_xy_16_sse(pel *src, pel *dst, int i_dst, int mode, int width, int height)
{
	ALIGNED_16(pel first_line[2 * (64 + 48)]);
	int line_size = width + height / 2 - 1;
	int left_size = line_size - width;
	int aligned_line_size = ((line_size + 31) >> 4) << 4;
    pel *pfirst[2];
	__m128i zero = _mm_setzero_si128();
	__m128i coeff2 = _mm_set1_epi16(2);
	__m128i coeff3 = _mm_set1_epi16(3);
	__m128i coeff4 = _mm_set1_epi16(4);
	__m128i shuffle1 = _mm_setr_epi8(0, 2, 4, 6, 8, 10, 12, 14, 1, 3, 5, 7, 9, 11, 13, 15);
	__m128i shuffle2 = _mm_setr_epi8(1, 3, 5, 7, 9, 11, 13, 15, 0, 2, 4, 6, 8, 10, 12, 14);
	int i;
    pel *src1;

    pfirst[0] = first_line;
    pfirst[1] = first_line + aligned_line_size;

	src -= height - 2;

	src1 = src;

	for (i = 0; i < left_size - 4; i += 8, src += 16)
	{
		__m128i p00, p01, p10, p11;
		__m128i S0 = _mm_loadu_si128((__m128i*)(src - 1));
		__m128i S2 = _mm_loadu_si128((__m128i*)(src + 1));
		__m128i S1 = _mm_loadu_si128((__m128i*)(src));

		__m128i L0 = _mm_unpacklo_epi8(S0, zero);
		__m128i L1 = _mm_unpacklo_epi8(S1, zero);
		__m128i L2 = _mm_unpacklo_epi8(S2, zero);

		__m128i H0 = _mm_unpackhi_epi8(S0, zero);
		__m128i H1 = _mm_unpackhi_epi8(S1, zero);
		__m128i H2 = _mm_unpackhi_epi8(S2, zero);

		p00 = _mm_add_epi16(L0, L1);
		p01 = _mm_add_epi16(L1, L2);
		p10 = _mm_add_epi16(H0, H1);
		p11 = _mm_add_epi16(H1, H2);

		p00 = _mm_add_epi16(p00, coeff2);
		p10 = _mm_add_epi16(p10, coeff2);

		p00 = _mm_add_epi16(p00, p01);
		p10 = _mm_add_epi16(p10, p11);

		p00 = _mm_srli_epi16(p00, 2);
		p10 = _mm_srli_epi16(p10, 2);
		p00 = _mm_packus_epi16(p00, p10);

		p10 = _mm_shuffle_epi8(p00, shuffle2);
		p00 = _mm_shuffle_epi8(p00, shuffle1);
		_mm_storel_epi64((__m128i*)&pfirst[1][i], p00);
		_mm_storel_epi64((__m128i*)&pfirst[0][i], p10);
	}

	if (i < left_size)
	{
		__m128i p00, p01;
		__m128i S0 = _mm_loadu_si128((__m128i*)(src - 1));
		__m128i S2 = _mm_loadu_si128((__m128i*)(src + 1));
		__m128i S1 = _mm_loadu_si128((__m128i*)(src));

		__m128i L0 = _mm_unpacklo_epi8(S0, zero);
		__m128i L1 = _mm_unpacklo_epi8(S1, zero);
		__m128i L2 = _mm_unpacklo_epi8(S2, zero);

		p00 = _mm_add_epi16(L0, L1);
		p01 = _mm_add_epi16(L1, L2);
		p00 = _mm_add_epi16(p00, coeff2);
		p00 = _mm_add_epi16(p00, p01);
		p00 = _mm_srli_epi16(p00, 2);
		p00 = _mm_packus_epi16(p00, p00);

		p01 = _mm_shuffle_epi8(p00, shuffle2);
		p00 = _mm_shuffle_epi8(p00, shuffle1);
		((int*)&pfirst[1][i])[0] = _mm_cvtsi128_si32(p00);
		((int*)&pfirst[0][i])[0] = _mm_cvtsi128_si32(p01);
	}

	src = src1 + left_size + left_size;

	for (i = left_size; i < line_size; i += 16, src += 16)
	{
		__m128i p00, p01, p10, p11;
		__m128i S0 = _mm_loadu_si128((__m128i*)(src - 1));
		__m128i S3 = _mm_loadu_si128((__m128i*)(src + 2));
		__m128i S1 = _mm_loadu_si128((__m128i*)(src));
		__m128i S2 = _mm_loadu_si128((__m128i*)(src + 1));

		__m128i L0 = _mm_unpacklo_epi8(S0, zero);
		__m128i L1 = _mm_unpacklo_epi8(S1, zero);
		__m128i L2 = _mm_unpacklo_epi8(S2, zero);
		__m128i L3 = _mm_unpacklo_epi8(S3, zero);

		__m128i H0 = _mm_unpackhi_epi8(S0, zero);
		__m128i H1 = _mm_unpackhi_epi8(S1, zero);
		__m128i H2 = _mm_unpackhi_epi8(S2, zero);
		__m128i H3 = _mm_unpackhi_epi8(S3, zero);

		p00 = _mm_add_epi16(L1, L2);
		p10 = _mm_add_epi16(H1, H2);
		p00 = _mm_mullo_epi16(p00, coeff3);
		p10 = _mm_mullo_epi16(p10, coeff3);

		p01 = _mm_add_epi16(L0, L3);
		p11 = _mm_add_epi16(H0, H3);
		p00 = _mm_add_epi16(p00, coeff4);
		p10 = _mm_add_epi16(p10, coeff4);
		p00 = _mm_add_epi16(p00, p01);
		p10 = _mm_add_epi16(p10, p11);

		p00 = _mm_srli_epi16(p00, 3);
		p10 = _mm_srli_epi16(p10, 3);

		p00 = _mm_packus_epi16(p00, p10);
		_mm_storeu_si128((__m128i*)&pfirst[0][i], p00);

		p00 = _mm_add_epi16(L0, L1);
		p01 = _mm_add_epi16(L1, L2);
		p10 = _mm_add_epi16(H0, H1);
		p11 = _mm_add_epi16(H1, H2);

		p00 = _mm_add_epi16(p00, coeff2);
		p10 = _mm_add_epi16(p10, coeff2);

		p00 = _mm_add_epi16(p00, p01);
		p10 = _mm_add_epi16(p10, p11);

		p00 = _mm_srli_epi16(p00, 2);
		p10 = _mm_srli_epi16(p10, 2);

		p00 = _mm_packus_epi16(p00, p10);
		_mm_storeu_si128((__m128i*)&pfirst[1][i], p00);
	}

	pfirst[0] += left_size;
	pfirst[1] += left_size;

	height >>= 1;

    switch (width) {
    case 4:
        for (i = 0; i < height; i++) {
            CP32(dst,         pfirst[0] - i);
            CP32(dst + i_dst, pfirst[1] - i);
            dst += (i_dst << 1);
        }
        break;
    case 8:
        for (i = 0; i < height; i++) {
            CP64(dst,         pfirst[0] - i);
            CP64(dst + i_dst, pfirst[1] - i);
            dst += (i_dst << 1);
        }
        break;
    case 16:
        for (i = 0; i < height; i++) {
            CP128(dst,         pfirst[0] - i);
            CP128(dst + i_dst, pfirst[1] - i);
            dst += (i_dst << 1);
        }
        break;
    default:
        for (i = 0; i < height; i++) {
            memcpy(dst,         pfirst[0] - i, width * sizeof(pel));
            memcpy(dst + i_dst, pfirst[1] - i, width * sizeof(pel));
            dst += (i_dst << 1);
        }
        break;
    }
	
}